

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mml.c
# Opt level: O2

int mml_get_value(char **ptr)

{
  char *pcVar1;
  ushort **ppuVar2;
  uint uVar3;
  
  ppuVar2 = __ctype_b_loc();
  uVar3 = 0;
  pcVar1 = *ptr;
  while( true ) {
    if ((*(byte *)((long)*ppuVar2 + (long)*pcVar1 * 2 + 1) & 8) == 0) {
      return uVar3;
    }
    if (0xffff < uVar3) break;
    uVar3 = (uVar3 * 10 + (int)*pcVar1) - 0x30;
    *ptr = pcVar1 + 1;
    pcVar1 = pcVar1 + 1;
  }
  return -1;
}

Assistant:

int
mml_get_value(char **ptr)
{
	unsigned int value;
	char c;

	/* get value */
	value = 0;

	for (;;) {
		c = **ptr;

		if (!isdigit(c))
			break;
		if (value > 65535)
			return (-1);

		value = (value * 10) + (c - '0');
		(*ptr)++;
	}

	/* ok */
	return (value);
}